

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O3

Scale * __thiscall
icu_63::number::Scale::byDecimal(Scale *__return_storage_ptr__,Scale *this,StringPiece multiplicand)

{
  DecNum *this_00;
  Scale *pSVar1;
  DecNum *p;
  StringPiece str;
  UErrorCode localError;
  UErrorCode local_2c;
  DecNum *local_28;
  
  str.length_ = multiplicand.ptr_._0_4_;
  local_2c = U_ZERO_ERROR;
  pSVar1 = this;
  this_00 = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)this);
  if (this_00 == (DecNum *)0x0) {
    local_2c = U_MEMORY_ALLOCATION_ERROR;
    __return_storage_ptr__->fMagnitude = 0;
    __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
    __return_storage_ptr__->fError = U_MEMORY_ALLOCATION_ERROR;
    this = pSVar1;
  }
  else {
    impl::DecNum::DecNum(this_00);
    str.ptr_ = (char *)this;
    str._12_4_ = 0;
    local_28 = this_00;
    impl::DecNum::setTo(this_00,str,&local_2c);
    if (U_ZERO_ERROR < local_2c) {
      __return_storage_ptr__->fMagnitude = 0;
      __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
      __return_storage_ptr__->fError = local_2c;
      MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray
                ((MaybeStackHeaderAndArray<decNumber,_char,_34> *)this_00);
      goto LAB_002637f1;
    }
    local_28 = (DecNum *)0x0;
    this = (Scale *)0x0;
    Scale(__return_storage_ptr__,0,this_00);
  }
  this_00 = (DecNum *)0x0;
LAB_002637f1:
  UMemory::operator_delete((UMemory *)this_00,this);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDecimal(StringPiece multiplicand) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {0, decnum.orphan()};
}